

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

KeywordNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::KeywordNameSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  Token keyword;
  KeywordNameSyntax *this_00;
  Token *args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (KeywordNameSyntax *)allocate(this,0x20,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  slang::syntax::KeywordNameSyntax::KeywordNameSyntax(this_00,*args,keyword);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }